

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

Optional<Catch::ColourMode> * __thiscall
Catch::Optional<Catch::ColourMode>::operator=
          (Optional<Catch::ColourMode> *this,Optional<Catch::ColourMode> *_other)

{
  ColourMode *pCVar1;
  
  if ((_other != this) &&
     (this->nullableValue = (ColourMode *)0x0, _other->nullableValue != (ColourMode *)0x0)) {
    pCVar1 = operator*(_other);
    this->storage[0] = *pCVar1;
    this->nullableValue = (ColourMode *)this->storage;
  }
  return this;
}

Assistant:

Optional& operator=( Optional&& _other ) {
            if ( &_other != this ) {
                reset();
                if ( _other ) {
                    nullableValue = new ( storage ) T( CATCH_MOVE( *_other ) );
                }
            }
            return *this;
        }